

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void fillRegion(QPainter *painter,QRegion *rgn,QBrush *brush)

{
  BrushStyle BVar1;
  int iVar2;
  long lVar3;
  QBrush *pQVar4;
  QBrush *pQVar5;
  ClipOperation in_ESI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *rect_1;
  const_iterator __end3;
  const_iterator __begin3;
  QRegion *__range3;
  QRect rect;
  QRect *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  QPoint *in_stack_ffffffffffffff90;
  QPainter *in_stack_ffffffffffffff98;
  QRect *in_stack_ffffffffffffffa0;
  QPainter *in_stack_ffffffffffffffa8;
  QPixmap local_30 [24];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BVar1 = QBrush::style((QBrush *)0x366dd1);
  if (BVar1 == TexturePattern) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = QRegion::boundingRect();
    QPainter::setClipRegion((QRegion *)in_RDI,in_ESI);
    QBrush::texture();
    QRect::topLeft(in_stack_ffffffffffffff78);
    QPainter::drawTiledPixmap
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (QPixmap *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    QPixmap::~QPixmap(local_30);
    goto LAB_00366fa7;
  }
  lVar3 = QBrush::gradient();
  if (lVar3 == 0) {
LAB_00366f23:
    pQVar4 = (QBrush *)QRegion::begin();
    pQVar5 = (QBrush *)QRegion::end();
    for (; pQVar4 != pQVar5; pQVar4 = pQVar4 + 0x10) {
      QPainter::fillRect(in_RDI,pQVar4);
    }
  }
  else {
    QBrush::gradient();
    iVar2 = QGradient::coordinateMode();
    if (iVar2 != 2) {
      QBrush::gradient();
      iVar2 = QGradient::coordinateMode();
      if (iVar2 != 3) goto LAB_00366f23;
    }
    QPainter::save();
    QPainter::setClipRegion((QRegion *)in_RDI,in_ESI);
    QPainter::device();
    iVar2 = QPaintDevice::width((QPaintDevice *)0x366ee5);
    QPainter::device();
    QPaintDevice::height((QPaintDevice *)0x366efb);
    QPainter::fillRect(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (int)in_stack_ffffffffffffff90,
                       (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (int)in_stack_ffffffffffffff88,
                       (QBrush *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
    QPainter::restore();
  }
LAB_00366fa7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void fillRegion(QPainter *painter, const QRegion &rgn, const QBrush &brush)
{
    Q_ASSERT(painter);

    if (brush.style() == Qt::TexturePattern) {
        const QRect rect(rgn.boundingRect());
        painter->setClipRegion(rgn);
        painter->drawTiledPixmap(rect, brush.texture(), rect.topLeft());
    } else if (brush.gradient()
               && (brush.gradient()->coordinateMode() == QGradient::ObjectBoundingMode
                   || brush.gradient()->coordinateMode() == QGradient::ObjectMode)) {
        painter->save();
        painter->setClipRegion(rgn);
        painter->fillRect(0, 0, painter->device()->width(), painter->device()->height(), brush);
        painter->restore();
    } else {
        for (const QRect &rect : rgn)
            painter->fillRect(rect, brush);
    }
}